

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeZone.cc
# Opt level: O2

tm * __thiscall
muduo::TimeZone::toLocalTime(tm *__return_storage_ptr__,TimeZone *this,time_t seconds)

{
  Data *data;
  Transition sentry;
  Localtime *pLVar1;
  uint uStack_2c;
  time_t localSeconds;
  
  *(undefined8 *)&__return_storage_ptr__->tm_isdst = 0;
  __return_storage_ptr__->tm_gmtoff = 0;
  __return_storage_ptr__->tm_mon = 0;
  __return_storage_ptr__->tm_year = 0;
  __return_storage_ptr__->tm_wday = 0;
  __return_storage_ptr__->tm_yday = 0;
  __return_storage_ptr__->tm_sec = 0;
  __return_storage_ptr__->tm_min = 0;
  __return_storage_ptr__->tm_hour = 0;
  __return_storage_ptr__->tm_mday = 0;
  __return_storage_ptr__->tm_zone = (char *)0x0;
  data = (this->data_).super___shared_ptr<muduo::TimeZone::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sentry.localtime = 0;
  sentry.gmttime = seconds;
  sentry._16_8_ = (ulong)uStack_2c << 0x20;
  pLVar1 = detail::findLocaltime(data,sentry,(Comp)0x1);
  if (pLVar1 != (Localtime *)0x0) {
    localSeconds = seconds + pLVar1->gmtOffset;
    gmtime_r(&localSeconds,(tm *)__return_storage_ptr__);
    __return_storage_ptr__->tm_isdst = (uint)pLVar1->isDst;
    __return_storage_ptr__->tm_gmtoff = pLVar1->gmtOffset;
    __return_storage_ptr__->tm_zone = (data->abbreviation)._M_dataplus._M_p + pLVar1->arrbIdx;
  }
  return __return_storage_ptr__;
}

Assistant:

struct tm TimeZone::toLocalTime(time_t seconds) const
{
  struct tm localTime;
  memZero(&localTime, sizeof(localTime));
  assert(data_ != NULL);
  const Data& data(*data_);

  detail::Transition sentry(seconds, 0, 0);
  const detail::Localtime* local = findLocaltime(data, sentry, detail::Comp(true));

  if (local)
  {
    time_t localSeconds = seconds + local->gmtOffset;
    ::gmtime_r(&localSeconds, &localTime); // FIXME: fromUtcTime
    localTime.tm_isdst = local->isDst;
    localTime.tm_gmtoff = local->gmtOffset;
    localTime.tm_zone = &data.abbreviation[local->arrbIdx];
  }

  return localTime;
}